

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

void Gia_ObjComputeTruthTable6_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Wrd_t *vTruths)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  word wVar5;
  word wVar6;
  
  iVar3 = Gia_ObjId(p,pObj);
  if (p->nTravIdsAlloc <= iVar3) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  piVar1 = p->pTravIds;
  iVar3 = Gia_ObjId(p,pObj);
  if (piVar1[iVar3] == p->nTravIds) {
    return;
  }
  Gia_ObjSetTravIdCurrent(p,pObj);
  uVar4 = (uint)*(undefined8 *)pObj;
  if ((uVar4 >> 0x1e & 1) != 0) {
    __assert_fail("!pObj->fMark0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                  ,0x18c,"void Gia_ObjComputeTruthTable6_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Wrd_t *)"
                 );
  }
  if ((-1 < (int)uVar4) && ((uVar4 & 0x1fffffff) != 0x1fffffff)) {
    Gia_ObjComputeTruthTable6_rec(p,pObj + -(ulong)(uVar4 & 0x1fffffff),vTruths);
    Gia_ObjComputeTruthTable6_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),vTruths)
    ;
    wVar5 = Vec_WrdEntry(vTruths,pObj[-(*(ulong *)pObj & 0x1fffffff)].Value);
    uVar2 = *(ulong *)pObj;
    wVar6 = Vec_WrdEntry(vTruths,pObj[-(uVar2 >> 0x20 & 0x1fffffff)].Value);
    pObj->Value = vTruths->nSize;
    Vec_WrdPush(vTruths,((*(long *)pObj << 2) >> 0x3f ^ wVar6) &
                        ((long)((int)uVar2 * 4 >> 0x1f) ^ wVar5));
    return;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                ,0x18d,"void Gia_ObjComputeTruthTable6_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Wrd_t *)");
}

Assistant:

void Gia_ObjComputeTruthTable6_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Wrd_t * vTruths )
{
    word uTruth0, uTruth1;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( !pObj->fMark0 );
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjComputeTruthTable6_rec( p, Gia_ObjFanin0(pObj), vTruths );
    Gia_ObjComputeTruthTable6_rec( p, Gia_ObjFanin1(pObj), vTruths );
    uTruth0 = Vec_WrdEntry( vTruths, Gia_ObjFanin0(pObj)->Value );
    uTruth0 = Gia_ObjFaninC0(pObj) ? ~uTruth0 : uTruth0;
    uTruth1 = Vec_WrdEntry( vTruths, Gia_ObjFanin1(pObj)->Value );
    uTruth1 = Gia_ObjFaninC1(pObj) ? ~uTruth1 : uTruth1;
    pObj->Value = Vec_WrdSize(vTruths);
    Vec_WrdPush( vTruths, uTruth0 & uTruth1 );
}